

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O2

int cm_zlib_gzsetparams(gzFile file,int level,int strategy)

{
  int iVar1;
  size_t sVar2;
  
  if ((file != (gzFile)0x0) && (*(char *)((long)file + 0xac) == 'w')) {
    if (*(int *)((long)file + 0x20) == 0) {
      *(void **)((long)file + 0x18) = *(void **)((long)file + 0x88);
      sVar2 = fwrite(*(void **)((long)file + 0x88),1,0x4000,*(FILE **)((long)file + 0x78));
      if (sVar2 != 0x4000) {
        *(undefined4 *)((long)file + 0x70) = 0xffffffff;
      }
      *(undefined4 *)((long)file + 0x20) = 0x4000;
    }
    iVar1 = cm_zlib_deflateParams((z_streamp_conflict)file,level,strategy);
    return iVar1;
  }
  return -2;
}

Assistant:

int ZEXPORT gzsetparams (file, level, strategy)
    gzFile file;
    int level;
    int strategy;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'w') return Z_STREAM_ERROR;

    /* Make room to allow flushing */
    if (s->stream.avail_out == 0) {

        s->stream.next_out = s->outbuf;
        if (fwrite(s->outbuf, 1, Z_BUFSIZE, s->file) != Z_BUFSIZE) {
            s->z_err = Z_ERRNO;
        }
        s->stream.avail_out = Z_BUFSIZE;
    }

    return deflateParams (&(s->stream), level, strategy);
}